

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonwriter.cpp
# Opt level: O0

void QJsonPrivate::Writer::objectToJson
               (QCborContainerPrivate *o,QByteArray *json,int indent,bool compact)

{
  long lVar1;
  qsizetype size;
  qsizetype qVar2;
  undefined1 in_CL;
  undefined4 in_EDX;
  QByteArray *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QByteArray *in_stack_ffffffffffffff88;
  QByteArray *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar3;
  char ch;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  QByteArray *in_stack_ffffffffffffffc0;
  undefined3 in_stack_ffffffffffffffc8;
  uint uVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = CONCAT13(in_CL,in_stack_ffffffffffffffc8) & 0x1ffffff;
  size = QByteArray::size(in_RSI);
  ch = (char)((ulong)in_RSI >> 0x38);
  if (in_RDI == 0) {
    uVar3 = 0x10;
  }
  else {
    qVar2 = QList<QtCbor::Element>::size((QList<QtCbor::Element> *)(in_RDI + 0x28));
    uVar3 = (undefined4)qVar2;
  }
  QByteArray::reserve((QByteArray *)CONCAT44(uVar3,in_stack_ffffffffffffffa0),
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  QByteArray::operator+=(in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
  objectContentToJson((QCborContainerPrivate *)CONCAT44(in_EDX,uVar4),in_stack_ffffffffffffffc0,
                      in_stack_ffffffffffffffbc,SUB41((uint)in_stack_ffffffffffffffb8 >> 0x18,0));
  QByteArray::QByteArray
            ((QByteArray *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),size,ch);
  QByteArray::operator+=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  QByteArray::~QByteArray((QByteArray *)0x4a40d7);
  QByteArray::operator+=(in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Writer::objectToJson(const QCborContainerPrivate *o, QByteArray &json, int indent, bool compact)
{
    json.reserve(json.size() + (o ? (int)o->elements.size() : 16));
    json += compact ? "{" : "{\n";
    objectContentToJson(o, json, indent + (compact ? 0 : 1), compact);
    json += QByteArray(4*indent, ' ');
    json += compact ? "}" : "}\n";
}